

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O0

void Eigen::internal::
     general_matrix_matrix_triangular_product<long,_double,_0,_false,_double,_1,_false,_0,_1,_0>::
     run(long size,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,ResScalar *res
        ,long resStride,ResScalar *alpha)

{
  double *pdVar1;
  ResScalar alpha_00;
  double dVar2;
  long lVar3;
  double dVar4;
  ResScalar *res_00;
  long lVar5;
  undefined8 blockA_00;
  ulong size_00;
  ulong uVar6;
  double *pdVar7;
  long *plVar8;
  double *pdVar9;
  double *pdVar10;
  size_t size_01;
  double local_178;
  ResScalar *local_170;
  long local_168;
  double *local_160;
  double *local_158;
  long local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  long local_120;
  long local_118;
  long actual_mc;
  long i2;
  double local_100;
  long actual_kc;
  long k2;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> sybb;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  double *pdStack_e8;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  double *blockB;
  aligned_stack_memory_handler<double> allocatedBlockB_stack_memory_destructor;
  double *allocatedBlockB;
  undefined1 local_b0 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeB;
  size_t sizeW;
  long nc;
  long mc;
  long kc;
  const_blas_data_mapper<double,_long,_1> rhs;
  const_blas_data_mapper<double,_long,_0> lhs;
  long rhsStride_local;
  double *_rhs_local;
  long lhsStride_local;
  double *_lhs_local;
  long depth_local;
  long size_local;
  ulong local_10;
  
  pdVar7 = &local_178;
  _lhs_local = (double *)depth;
  depth_local = size;
  const_blas_data_mapper<double,_long,_0>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_0> *)&rhs.m_stride,_lhs,lhsStride);
  const_blas_data_mapper<double,_long,_1>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_1> *)&kc,_rhs,rhsStride);
  mc = (long)_lhs_local;
  nc = depth_local;
  sizeW = depth_local;
  computeProductBlockingSizes<double,double,long>(&mc,&nc,(long *)&sizeW);
  lVar3 = mc;
  if (4 < nc) {
    nc = nc / 4 << 2;
  }
  size_00 = mc * 8 + mc * depth_local;
  local_10 = mc * nc;
  if (0x1fffffffffffffff < local_10) {
    throw_std_bad_alloc();
  }
  if ((ulong)(mc * 8 * nc) < 0x20001) {
    pdVar7 = (double *)((long)&local_178 - (mc * nc * 8 + 0xfU & 0xfffffffffffffff0));
    local_128 = pdVar7;
  }
  else {
    local_128 = (double *)aligned_malloc(mc * 8 * nc);
  }
  pdVar1 = local_128;
  blockA_stack_memory_destructor._16_8_ = local_128;
  size_01 = mc * nc;
  uVar6 = mc * 8 * nc;
  pdVar7[-1] = 5.77555823069375e-318;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_b0,pdVar1,size_01,0x20000 < uVar6);
  size_local = size_00;
  if (0x1fffffffffffffff < size_00) {
    pdVar7[-1] = 5.77571633170042e-318;
    throw_std_bad_alloc();
  }
  if (size_00 * 8 < 0x20001) {
    pdVar7 = (double *)((long)pdVar7 - (size_00 * 8 + 0xf & 0xfffffffffffffff0));
    local_130 = pdVar7;
  }
  else {
    pdVar7[-1] = 5.77610170290418e-318;
    local_138 = (double *)aligned_malloc(size_00 * 8);
    local_130 = local_138;
  }
  pdVar1 = local_130;
  allocatedBlockB_stack_memory_destructor._16_8_ = local_130;
  pdVar7[-1] = 5.77651671804669e-318;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB,pdVar1,size_00,0x20000 < size_00 * 8);
  pdStack_e8 = (double *)(allocatedBlockB_stack_memory_destructor._16_8_ + lVar3 * 0x40);
  for (actual_kc = 0; actual_kc < (long)_lhs_local; actual_kc = mc + actual_kc) {
    i2 = actual_kc + mc;
    pdVar7[-1] = 5.77697125844086e-318;
    plVar8 = std::min<long>(&i2,(long *)&_lhs_local);
    lVar3 = actual_kc;
    local_100 = (double)(*plVar8 - actual_kc);
    local_140 = pdStack_e8;
    pdVar7[-1] = 5.77723805388961e-318;
    pdVar9 = const_blas_data_mapper<double,_long,_1>::operator()
                       ((const_blas_data_mapper<double,_long,_1> *)&kc,lVar3,0);
    lVar3 = depth_local;
    dVar2 = local_100;
    pdVar1 = local_140;
    pdVar7[-1] = 0.0;
    pdVar7[-2] = 0.0;
    pdVar7[-3] = 5.77752955262066e-318;
    gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
              ((gemm_pack_rhs<double,_long,_4,_1,_false,_false> *)((long)&k2 + 6),pdVar1,pdVar9,
               rhsStride,(long)dVar2,lVar3,(long)pdVar7[-2],(long)pdVar7[-1]);
    for (actual_mc = 0; actual_mc < depth_local; actual_mc = nc + actual_mc) {
      local_120 = actual_mc + nc;
      pdVar7[-1] = 5.77788033922921e-318;
      plVar8 = std::min<long>(&local_120,&depth_local);
      lVar5 = actual_kc;
      lVar3 = actual_mc;
      local_118 = *plVar8 - actual_mc;
      local_148 = (double *)blockA_stack_memory_destructor._16_8_;
      pdVar7[-1] = 5.77816195664734e-318;
      pdVar9 = const_blas_data_mapper<double,_long,_0>::operator()
                         ((const_blas_data_mapper<double,_long,_0> *)&rhs.m_stride,lVar3,lVar5);
      dVar2 = local_100;
      lVar3 = local_118;
      pdVar1 = local_148;
      pdVar7[-1] = 0.0;
      pdVar7[-2] = 0.0;
      pdVar7[-3] = 5.77846827734776e-318;
      gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *)((long)&k2 + 7),pdVar1,pdVar9
                 ,lhsStride,(long)dVar2,lVar3,(long)pdVar7[-2],(long)pdVar7[-1]);
      local_170 = res + actual_mc;
      local_168 = resStride;
      local_160 = (double *)blockA_stack_memory_destructor._16_8_;
      local_158 = pdStack_e8;
      local_150 = local_118;
      local_178 = local_100;
      pdVar7[-1] = 5.77901669021464e-318;
      pdVar10 = (double *)std::min<long>(&depth_local,&actual_mc);
      lVar5 = local_150;
      pdVar9 = local_158;
      pdVar1 = local_160;
      lVar3 = local_168;
      res_00 = local_170;
      dVar4 = local_178;
      dVar2 = *pdVar10;
      alpha_00 = *alpha;
      pdVar7[-2] = (double)allocatedBlockB_stack_memory_destructor._16_8_;
      pdVar7[-7] = dVar2;
      pdVar7[-8] = dVar4;
      pdVar7[-3] = 0.0;
      pdVar7[-4] = 0.0;
      pdVar7[-5] = -NAN;
      pdVar7[-6] = -NAN;
      pdVar7[-9] = 5.77961945030257e-318;
      gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&k2 + 5),res_00,
                 lVar3,pdVar1,pdVar9,lVar5,(long)pdVar7[-8],(long)pdVar7[-7],alpha_00,
                 (long)pdVar7[-6],(long)pdVar7[-5],(long)pdVar7[-4],(long)pdVar7[-3],
                 (double *)pdVar7[-2]);
      blockA_00 = blockA_stack_memory_destructor._16_8_;
      dVar2 = local_100;
      lVar5 = local_118;
      lVar3 = resStride * actual_mc + actual_mc;
      pdVar1 = pdStack_e8 + (long)local_100 * actual_mc;
      pdVar7[-2] = (double)allocatedBlockB_stack_memory_destructor._16_8_;
      pdVar7[-3] = (double)alpha;
      pdVar7[-4] = dVar2;
      pdVar7[-5] = 5.78019256645175e-318;
      tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
                ((tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> *)((long)&k2 + 4),
                 res + lVar3,resStride,(double *)blockA_00,pdVar1,lVar5,(long)pdVar7[-4],
                 (ResScalar *)pdVar7[-3],(double *)pdVar7[-2]);
    }
  }
  pdVar7[-1] = 5.78078544522675e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB);
  pdVar7[-1] = 5.78084473310426e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_b0);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Index size, Index depth,const LhsScalar* _lhs, Index lhsStride,
                                      const RhsScalar* _rhs, Index rhsStride, ResScalar* res, Index resStride, const ResScalar& alpha)
  {
    const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
    const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

    typedef gebp_traits<LhsScalar,RhsScalar> Traits;

    Index kc = depth; // cache block size along the K direction
    Index mc = size;  // cache block size along the M direction
    Index nc = size;  // cache block size along the N direction
    computeProductBlockingSizes<LhsScalar,RhsScalar>(kc, mc, nc);
    // !!! mc must be a multiple of nr:
    if(mc > Traits::nr)
      mc = (mc/Traits::nr)*Traits::nr;

    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    std::size_t sizeB = sizeW + kc*size;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, kc*mc, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, allocatedBlockB, sizeB, 0);
    RhsScalar* blockB = allocatedBlockB + sizeW;
    
    gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
    gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
    gebp_kernel <LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;
    tribb_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs, UpLo> sybb;

    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // note that the actual rhs is the transpose/adjoint of mat
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, size);

      for(Index i2=0; i2<size; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,size)-i2;

        pack_lhs(blockA, &lhs(i2, k2), lhsStride, actual_kc, actual_mc);

        // the selected actual_mc * size panel of res is split into three different part:
        //  1 - before the diagonal => processed with gebp or skipped
        //  2 - the actual_mc x actual_mc symmetric block => processed with a special kernel
        //  3 - after the diagonal => processed with gebp or skipped
        if (UpLo==Lower)
          gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, (std::min)(size,i2), alpha,
               -1, -1, 0, 0, allocatedBlockB);

        sybb(res+resStride*i2 + i2, resStride, blockA, blockB + actual_kc*i2, actual_mc, actual_kc, alpha, allocatedBlockB);

        if (UpLo==Upper)
        {
          Index j2 = i2+actual_mc;
          gebp(res+resStride*j2+i2, resStride, blockA, blockB+actual_kc*j2, actual_mc, actual_kc, (std::max)(Index(0), size-j2), alpha,
               -1, -1, 0, 0, allocatedBlockB);
        }
      }
    }
  }